

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::get_remote_ip_and_port(socket_t sock,string *ip,int *port)

{
  int iVar1;
  undefined4 *in_RDX;
  int in_EDI;
  socklen_t len;
  ucred ucred;
  socklen_t addr_len;
  sockaddr_storage addr;
  int *in_stack_00000370;
  string *in_stack_00000378;
  socklen_t in_stack_00000384;
  sockaddr_storage *in_stack_00000388;
  socklen_t local_ac;
  undefined4 local_a8 [3];
  socklen_t local_9c;
  sockaddr local_98 [8];
  undefined4 *local_18;
  int local_4;
  
  local_9c = 0x80;
  local_18 = in_RDX;
  local_4 = in_EDI;
  iVar1 = getpeername(in_EDI,local_98,&local_9c);
  if (iVar1 == 0) {
    if (local_98[0].sa_family == 1) {
      local_ac = 0xc;
      iVar1 = getsockopt(local_4,1,0x11,local_a8,&local_ac);
      if (iVar1 == 0) {
        *local_18 = local_a8[0];
      }
    }
    else {
      get_ip_and_port(in_stack_00000388,in_stack_00000384,in_stack_00000378,in_stack_00000370);
    }
  }
  return;
}

Assistant:

inline void get_remote_ip_and_port(socket_t sock, std::string &ip, int &port) {
  struct sockaddr_storage addr;
  socklen_t addr_len = sizeof(addr);

  if (!getpeername(sock, reinterpret_cast<struct sockaddr *>(&addr),
                   &addr_len)) {
#ifndef _WIN32
    if (addr.ss_family == AF_UNIX) {
#if defined(__linux__)
      struct ucred ucred;
      socklen_t len = sizeof(ucred);
      if (getsockopt(sock, SOL_SOCKET, SO_PEERCRED, &ucred, &len) == 0) {
        port = ucred.pid;
      }
#elif defined(SOL_LOCAL) && defined(SO_PEERPID) // __APPLE__
      pid_t pid;
      socklen_t len = sizeof(pid);
      if (getsockopt(sock, SOL_LOCAL, SO_PEERPID, &pid, &len) == 0) {
        port = pid;
      }
#endif
      return;
    }
#endif
    get_ip_and_port(addr, addr_len, ip, port);
  }
}